

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O3

uint64_t ParseUint64Cell(char *line,size_t *index)

{
  uint64_t uVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  
  uVar2 = *index;
  while ((uVar4 = (ulong)(byte)line[uVar2], uVar3 = uVar2, uVar4 < 0x21 &&
         ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
    uVar2 = uVar2 + 1;
  }
  while ((0x2c < (byte)uVar4 || ((0x100100002601U >> (uVar4 & 0x3f) & 1) == 0))) {
    uVar4 = (ulong)(byte)line[uVar3 + 1];
    uVar3 = uVar3 + 1;
  }
  pbVar6 = (byte *)(line + uVar3);
  uVar5 = uVar3;
  do {
    pbVar6 = pbVar6 + 1;
    if (0x2c < (byte)uVar4) {
LAB_00164c78:
      *index = uVar5;
      uVar1 = 0;
      for (; uVar2 <= uVar3; uVar2 = uVar2 + 1) {
        if ((byte)(line[uVar2] - 0x30U) < 10) {
          uVar1 = (ulong)((byte)line[uVar2] & 0xf) + uVar1 * 10;
        }
      }
      return uVar1;
    }
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0x2c) {
        uVar5 = uVar5 + 1;
      }
      goto LAB_00164c78;
    }
    uVar5 = uVar5 + 1;
    uVar4 = (ulong)*pbVar6;
  } while( true );
}

Assistant:

void ParseCsvCell(char const* line, size_t* index, size_t* index_first, size_t* index_last)
{
    size_t i = *index;

    /* Skip the first blanks */
    while (line[i] == ' ' || line[i] == '\t' || line[i] == '\r' || line[i] == '\n') {
        i++;
    }
    /* Skip until the next blank or comma */
    *index_first = i;
    while (line[i] != ' ' && line[i] != '\t' && line[i] != '\r' && line[i] != '\n' && line[i] != ',' && line[i] != 0) {
        i++;
    }
    *index_last = i;
    /* Skip the blanks until the comma */
    while (line[i] == ' ' || line[i] == '\t' || line[i] == '\r' || line[i] == '\n') {
        i++;
    }
    /* Skip the comma if present */
    if (line[i] == ',') {
        i++;
    }
    *index = i;
}